

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void MultiplicationHelper<unsigned_long,_long_long,_7>::
     MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long *t,longlong *u,unsigned_long *ret)

{
  undefined8 *in_RDX;
  uint64_t tmp;
  int64_t u1;
  uint64_t t1;
  int64_t in_stack_ffffffffffffffc8;
  undefined8 uVar1;
  
  uVar1 = 0;
  LargeIntRegMultiply<unsigned_long,_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((uint64_t *)0x0,in_stack_ffffffffffffffc8,(uint64_t *)0x1e43ca);
  *in_RDX = uVar1;
  return;
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY static void MultiplyThrow(const T& t, const U& u, T& ret) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<T>::isUint64 && safeint_internal::int_traits<U>::isInt64, "T must be Uint64, U Int64");
        std::uint64_t t1 = t;
        std::int64_t          u1 = u;
        std::uint64_t tmp = 0;
        LargeIntRegMultiply< std::uint64_t, std::int64_t >::template RegMultiplyThrow< E >(t1, u1, &tmp);
        ret = tmp;
    }